

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O3

base_learner * bs_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  uint uVar2;
  undefined4 uVar3;
  int iVar4;
  bs *location;
  option_group_definition *this;
  vector<double,_std::allocator<double>_> *this_00;
  base_learner *l;
  single_learner *__src;
  learner<bs,_example> *__dest;
  size_t sVar5;
  string type_string;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  long local_390;
  string local_388;
  option_group_definition local_368;
  long *local_330;
  long local_328;
  long local_320 [2];
  _func_int ***local_310;
  _func_int **local_308;
  _func_int **local_300 [2];
  string local_2f0;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined2 local_2b8;
  undefined1 local_2b0 [112];
  bool local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [112];
  bool local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  typed_option<unsigned_int> local_d0;
  
  location = calloc_or_throw<bs>(1);
  *(undefined8 *)location = 0;
  location->bs_type = 0;
  location->lb = 0.0;
  location->ub = 0.0;
  location->pred_vec = (vector<double,_std::allocator<double>_> *)0x0;
  location->all = (vw *)0x0;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0.field_2._M_allocated_capacity._0_4_ = 0x6e61656d;
  local_3b0._M_string_length = 4;
  local_3b0.field_2._M_local_buf[4] = '\0';
  local_2c0 = 0x61727473746f6f42;
  local_2b8 = 0x70;
  local_2c8 = 9;
  local_368.m_name._M_dataplus._M_p = (pointer)&local_368.m_name.field_2;
  local_2d0 = &local_2c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_368,&local_2c0,(long)&local_2b8 + 1);
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388.field_2._M_allocated_capacity = 0x61727473746f6f62;
  local_388.field_2._8_2_ = 0x70;
  local_388._M_string_length = 9;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_2b0,&local_388,&location->B);
  local_240 = true;
  local_210._0_8_ = (_func_int **)0x2f;
  local_310 = local_300;
  local_310 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)local_210);
  local_300[0] = (_func_int **)local_210._0_8_;
  builtin_strncpy((char *)((long)local_310 + 0x1f),"tance re",8);
  builtin_strncpy((char *)((long)local_310 + 0x27),"sampling",8);
  local_310[2] = (_func_int **)0x6e696c6e6f207962;
  local_310[3] = (_func_int **)0x74726f706d692065;
  *local_310 = (_func_int **)0x6f62207961772d6b;
  local_310[1] = (_func_int **)0x207061727473746f;
  local_308 = (_func_int **)local_210._0_8_;
  *(char *)((long)local_310 + local_210._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_2b0);
  this = VW::config::option_group_definition::add<unsigned_int>(&local_368,&local_d0);
  local_2f0.field_2._M_allocated_capacity._0_4_ = 0x745f7362;
  local_2f0.field_2._M_allocated_capacity._4_3_ = 0x657079;
  local_2f0._M_string_length = 7;
  local_2f0.field_2._M_local_buf[7] = '\0';
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210,&local_2f0,&local_3b0);
  local_1a0 = true;
  local_390 = 0x1b;
  local_330 = local_320;
  local_330 = (long *)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_390);
  local_320[0] = local_390;
  builtin_strncpy((char *)((long)local_330 + 0xb),"type {me",8);
  builtin_strncpy((char *)((long)local_330 + 0x13),"an,vote}",8);
  *local_330 = 0x6974636964657270;
  local_330[1] = 0x2065707974206e6f;
  local_328 = local_390;
  *(char *)((long)local_330 + local_390) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_170,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210);
  VW::config::option_group_definition::add<std::__cxx11::string>(this,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4190;
  if (local_170.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_170.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_330 != local_320) {
    operator_delete(local_330);
  }
  local_210._0_8_ = &PTR__typed_option_002d4190;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4238;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_310 != local_300) {
    operator_delete(local_310);
  }
  local_2b0._0_8_ = &PTR__typed_option_002d4238;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_368);
  pp_Var1 = (_func_int **)(local_2b0 + 0x10);
  local_2b0._16_8_ = 0x61727473746f6f62;
  local_2b0._24_2_ = 0x70;
  local_2b0._8_8_ = (pointer)0x9;
  local_2b0._0_8_ = pp_Var1;
  iVar4 = (*options->_vptr_options_i[1])(options,local_2b0);
  if ((_func_int **)local_2b0._0_8_ != pp_Var1) {
    operator_delete((void *)local_2b0._0_8_);
  }
  if ((char)iVar4 == '\0') {
    __dest = (learner<bs,_example> *)0x0;
    goto LAB_001c7d00;
  }
  location->lb = -3.4028235e+38;
  location->ub = 3.4028235e+38;
  local_2b0._8_8_ = (pointer)0x7;
  local_2b0._16_8_ = 0x657079745f7362;
  local_2b0._0_8_ = pp_Var1;
  iVar4 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_2b0._0_8_ != pp_Var1) {
    operator_delete((void *)local_2b0._0_8_);
  }
  if ((char)iVar4 == '\0') {
LAB_001c7beb:
    sVar5 = 0;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_3b0);
    if (iVar4 == 0) goto LAB_001c7beb;
    iVar4 = std::__cxx11::string::compare((char *)&local_3b0);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "warning: bs_type must be in {\'mean\',\'vote\'}; resetting to mean.",0x3f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      goto LAB_001c7beb;
    }
    sVar5 = 1;
  }
  location->bs_type = sVar5;
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  location->pred_vec = this_00;
  std::vector<double,_std::allocator<double>_>::reserve(this_00,(ulong)location->B);
  location->all = all;
  l = setup_base(options,all);
  __src = LEARNER::as_singleline<char,char>(l);
  uVar2 = location->B;
  uVar3 = *(undefined4 *)(__src + 0xd0);
  __dest = calloc_or_throw<LEARNER::learner<bs,example>>(1);
  memcpy(__dest,__src,0xe9);
  *(single_learner **)(__dest + 0x20) = __src;
  *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
  *(bs **)(__dest + 0xb8) = location;
  *(single_learner **)(__dest + 0xc0) = __src;
  *(code **)(__dest + 200) = LEARNER::noop;
  *(ulong *)(__dest + 0xd8) = (ulong)uVar2;
  *(ulong *)(__dest + 0xe0) = (ulong)uVar2 * *(long *)(__src + 0xe0);
  *(bs **)(__dest + 0x18) = location;
  *(code **)(__dest + 0x28) = predict_or_learn<true>;
  *(code **)(__dest + 0x38) = predict_or_learn<true>;
  *(code **)(__dest + 0x30) = predict_or_learn<false>;
  *(undefined8 *)(__dest + 0x40) = 0;
  *(undefined4 *)(__dest + 0xd0) = uVar3;
  __dest[0xe8] = (learner<bs,_example>)0x0;
  *(bs **)(__dest + 0x58) = location;
  *(code **)(__dest + 0x68) = finish_example;
  *(bs **)(__dest + 0xb8) = location;
  *(single_learner **)(__dest + 0xc0) = __src;
  *(code **)(__dest + 200) = finish;
  location = (bs *)0x0;
LAB_001c7d00:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_368.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
    operator_delete(local_368.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if (location != (bs *)0x0) {
    free(location);
  }
  return (base_learner *)__dest;
}

Assistant:

base_learner* bs_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<bs>();
  std::string type_string("mean");
  option_group_definition new_options("Bootstrap");
  new_options.add(make_option("bootstrap", data->B).keep().help("k-way bootstrap by online importance resampling"))
      .add(make_option("bs_type", type_string).keep().help("prediction type {mean,vote}"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("bootstrap"))
    return nullptr;

  data->ub = FLT_MAX;
  data->lb = -FLT_MAX;

  if (options.was_supplied("bs_type"))
  {
    if (type_string.compare("mean") == 0)
      data->bs_type = BS_TYPE_MEAN;
    else if (type_string.compare("vote") == 0)
      data->bs_type = BS_TYPE_VOTE;
    else
    {
      std::cerr << "warning: bs_type must be in {'mean','vote'}; resetting to mean." << std::endl;
      data->bs_type = BS_TYPE_MEAN;
    }
  }
  else  // by default use mean
    data->bs_type = BS_TYPE_MEAN;

  data->pred_vec = new vector<double>();
  data->pred_vec->reserve(data->B);
  data->all = &all;

  learner<bs, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->B);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}